

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bicubic_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_2d_bicubic_apply_interpolation_p8
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  long lVar12;
  long lVar13;
  undefined8 *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar14;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  float fVar26;
  __m256 _v;
  __m256 x3_val;
  __m256 x2_val;
  __m256 x1_val;
  __m256 x0_val;
  int ii;
  int *offset_ptr;
  __m256 value_f [4];
  __m256 y_coeffs3;
  __m256 y_coeffs2;
  __m256 y_coeffs1;
  __m256 y_coeffs0;
  __m256 x_coeffs3;
  __m256 x_coeffs2;
  __m256 x_coeffs1;
  __m256 x_coeffs0;
  int i;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outh;
  int outw;
  int channels;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  undefined8 local_d60;
  undefined8 uStackY_d58;
  undefined8 uStackY_d50;
  undefined8 uStackY_d48;
  undefined8 local_d20;
  undefined8 uStackY_d18;
  undefined8 uStackY_d10;
  __m256 *in_stack_fffffffffffff2f8;
  __m256 *in_stack_fffffffffffff300;
  __m256 *in_stack_fffffffffffff308;
  __m256 *in_stack_fffffffffffff310;
  undefined4 in_stack_fffffffffffff318;
  undefined4 in_stack_fffffffffffff31c;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  __m256 *pafStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  int local_b4c;
  uint *local_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  float local_b00 [2];
  undefined8 uStack_af8;
  float afStack_af0 [2];
  undefined8 uStack_ae8;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  int local_978;
  undefined8 local_968;
  undefined8 local_960;
  undefined8 local_958;
  undefined4 local_950;
  undefined8 local_948;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined8 local_928;
  uint *local_920;
  undefined8 local_918;
  undefined8 local_910;
  undefined8 local_908;
  undefined4 local_900;
  long local_8f8;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined8 local_8d8;
  undefined8 *local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined4 local_8b0;
  long local_8a8;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  undefined4 local_890;
  undefined8 local_888;
  long local_880;
  int local_874;
  int local_870;
  int local_86c;
  int local_868;
  int local_864;
  undefined8 *local_858;
  long *local_850;
  long *local_848;
  undefined8 *local_840;
  undefined8 *local_838;
  undefined8 *local_830;
  undefined8 *local_808;
  undefined8 *local_7f8;
  undefined8 *local_7e8;
  undefined1 local_7bd;
  int local_7bc;
  undefined8 *local_7b0;
  undefined8 *local_788;
  undefined1 local_77d;
  undefined4 local_77c;
  undefined8 *local_770;
  undefined1 local_745;
  int local_744;
  undefined8 *local_738;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined4 local_6e0;
  undefined4 local_6dc;
  uint local_6d8;
  uint local_6d4;
  float *local_6d0;
  undefined1 *local_6c8;
  float *local_6c0;
  float *local_6b8;
  undefined1 *local_6b0;
  float *local_6a8;
  float *local_6a0;
  undefined1 *local_698;
  float *local_690;
  float *local_688;
  undefined8 *local_680;
  float *local_678;
  float *local_670;
  undefined8 *local_668;
  float *local_660;
  float *local_658;
  undefined8 *local_650;
  float *local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 *local_620;
  long local_618;
  undefined4 local_60c;
  long local_608;
  undefined8 *local_600;
  undefined4 local_5f4;
  int local_5f0;
  int local_5ec;
  undefined8 *local_5e8;
  undefined8 local_5e0;
  undefined4 local_5d4;
  long local_5d0;
  uint *local_5c8;
  undefined4 local_5bc;
  int local_5b8;
  int local_5b4;
  undefined8 *local_5b0;
  long local_5a8;
  undefined4 local_59c;
  long local_598;
  long local_590;
  undefined4 local_584;
  int local_580;
  int local_57c;
  undefined8 *local_578;
  undefined4 local_56c;
  long local_568;
  undefined4 local_55c;
  long local_558;
  undefined4 local_54c;
  long local_548;
  undefined1 local_540 [16];
  undefined1 auStack_530 [16];
  uint local_520;
  uint local_51c;
  uint local_518;
  uint local_514;
  uint local_510;
  uint local_50c;
  uint local_508;
  uint local_504;
  undefined1 local_500 [32];
  uint local_4e0;
  uint local_4dc;
  uint local_4d8;
  uint local_4d4;
  uint local_4d0;
  uint local_4cc;
  uint local_4c8;
  uint local_4c4;
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  undefined4 local_484;
  undefined1 local_480 [32];
  undefined4 local_460;
  undefined4 local_45c;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 local_408;
  undefined4 local_404;
  undefined1 local_400 [32];
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  __m256 *pafStack_1e8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 *local_38;
  
  local_864 = (int)in_RSI[7];
  local_868 = *(int *)((long)in_RSI + 0x2c);
  local_86c = (int)in_RSI[6];
  local_870 = local_868 * local_86c;
  local_858 = in_RDX;
  local_850 = in_RSI;
  local_848 = in_RDI;
  for (local_874 = 0; local_874 < local_864; local_874 = local_874 + 1) {
    local_7b0 = &local_8c8;
    local_57c = *(int *)((long)local_848 + 0x2c);
    local_580 = (int)local_848[6];
    local_584 = *(undefined4 *)((long)local_848 + 0x34);
    local_880 = *local_848 + local_848[8] * (long)local_874 * local_848[2];
    local_598 = local_848[2];
    local_59c = (undefined4)local_848[3];
    local_5a8 = local_848[4];
    local_578 = &local_8c8;
    local_568 = (long)local_57c * (long)local_580 * local_598;
    local_788 = &local_8c8;
    local_840 = &local_8c8;
    local_738 = &local_918;
    local_5ec = *(int *)((long)local_850 + 0x2c);
    local_5f0 = (int)local_850[6];
    local_5f4 = *(undefined4 *)((long)local_850 + 0x34);
    local_8d0 = (undefined8 *)(*local_850 + local_850[8] * (long)local_874 * local_850[2]);
    local_608 = local_850[2];
    local_60c = (undefined4)local_850[3];
    local_618 = local_850[4];
    local_5e8 = &local_918;
    local_548 = (long)local_5ec * (long)local_5f0 * local_608;
    local_710 = &local_918;
    local_838 = &local_918;
    local_770 = &local_968;
    local_5b4 = *(int *)((long)local_858 + 0x2c);
    local_5b8 = *(int *)(local_858 + 6);
    local_5bc = *(undefined4 *)((long)local_858 + 0x34);
    local_920 = (uint *)*local_858;
    local_5d0 = local_858[2];
    local_5d4 = *(undefined4 *)(local_858 + 3);
    local_5e0 = local_858[4];
    local_5b0 = &local_968;
    local_558 = (long)local_5b4 * (long)local_5b8 * local_5d0;
    local_38 = &local_968;
    local_830 = &local_968;
    local_890 = 0;
    local_894 = 0;
    local_898 = 0;
    local_89c = 0;
    local_8b0 = 0;
    local_8b8 = 0;
    local_8c0 = 0;
    local_8c8 = 0;
    local_8e0 = 0;
    local_8e4 = 0;
    local_8e8 = 0;
    local_8ec = 0;
    local_900 = 0;
    local_908 = 0;
    local_910 = 0;
    local_918 = 0;
    local_54c = 0x10;
    local_55c = 0x10;
    local_56c = 0x10;
    local_744 = local_874;
    local_745 = 1;
    local_77c = 0;
    local_77d = 1;
    local_7bc = local_874;
    local_7bd = 1;
    local_888 = 0;
    local_8a0 = 0;
    local_8d8 = 0;
    local_8f0 = 0;
    local_968 = 0;
    local_958 = 0;
    local_950 = 0;
    local_940 = 0;
    local_93c = 0;
    local_938 = 0;
    local_934 = 0;
    local_930 = 0;
    local_928 = 0;
    local_960 = 0;
    local_808 = local_830;
    local_7f8 = local_838;
    local_7e8 = local_840;
    local_600 = local_8d0;
    local_5c8 = local_920;
    local_590 = local_880;
    local_948 = local_5e0;
    local_8f8 = local_618;
    local_8a8 = local_5a8;
    for (local_978 = 0; local_978 < local_870; local_978 = local_978 + 1) {
      local_6d4 = *local_920;
      auVar1 = vinsertps_avx(ZEXT416(local_6d4),ZEXT416(local_6d4),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6d4),0x20);
      local_540 = vinsertps_avx(auVar1,ZEXT416(local_6d4),0x30);
      auVar1 = vinsertps_avx(ZEXT416(local_6d4),ZEXT416(local_6d4),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6d4),0x20);
      auStack_530 = vinsertps_avx(auVar1,ZEXT416(local_6d4),0x30);
      local_b20 = local_540._0_8_;
      uStack_b18 = local_540._8_8_;
      uStack_b10 = auStack_530._0_8_;
      uStack_b08 = auStack_530._8_8_;
      local_520 = local_6d4;
      local_51c = local_6d4;
      local_518 = local_6d4;
      local_514 = local_6d4;
      local_510 = local_6d4;
      local_50c = local_6d4;
      local_508 = local_6d4;
      local_504 = local_6d4;
      cubic_interp1d_p8((__m256 *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318),
                        in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                        in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
      local_6d8 = local_920[1];
      auVar1 = vinsertps_avx(ZEXT416(local_6d8),ZEXT416(local_6d8),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6d8),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6d8),0x30);
      auVar2 = vinsertps_avx(ZEXT416(local_6d8),ZEXT416(local_6d8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(local_6d8),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(local_6d8),0x30);
      auVar15._16_16_ = auVar1;
      auVar15._0_16_ = auVar2;
      local_500._0_8_ = auVar2._0_8_;
      local_500._8_8_ = auVar2._8_8_;
      local_500._16_8_ = auVar1._0_8_;
      local_500._24_8_ = auVar1._8_8_;
      local_b40 = local_500._0_8_;
      uStack_b38 = local_500._8_8_;
      uStack_b30 = local_500._16_8_;
      uStack_b28 = local_500._24_8_;
      local_500 = auVar15;
      local_4e0 = local_6d8;
      local_4dc = local_6d8;
      local_4d8 = local_6d8;
      local_4d4 = local_6d8;
      local_4d0 = local_6d8;
      local_4cc = local_6d8;
      local_4c8 = local_6d8;
      local_4c4 = local_6d8;
      cubic_interp1d_p8((__m256 *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318),
                        in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                        in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
      local_b48 = local_920 + 2;
      for (local_b4c = 0; local_b4c < 4; local_b4c = local_b4c + 1) {
        if ((int)*local_b48 < 0) {
          local_6dc = 0;
          local_484 = 0;
          local_488 = 0;
          local_48c = 0;
          local_490 = 0;
          local_494 = 0;
          local_498 = 0;
          local_49c = 0;
          local_4a0 = 0;
          auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
          auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
          auVar16._16_16_ = auVar1;
          auVar16._0_16_ = auVar2;
          local_4c0._0_8_ = auVar2._0_8_;
          local_4c0._8_8_ = auVar2._8_8_;
          local_4c0._16_8_ = auVar1._0_8_;
          local_4c0._24_8_ = auVar1._8_8_;
          local_ca0 = local_4c0._0_8_;
          uStack_c98 = local_4c0._8_8_;
          uStack_c90 = local_4c0._16_8_;
          uStack_c88 = local_4c0._24_8_;
          local_4c0 = auVar16;
        }
        else {
          local_6f0 = (undefined8 *)(local_880 + (long)(int)*local_b48 * 4);
          local_ca0 = *local_6f0;
          uStack_c98 = local_6f0[1];
          uStack_c90 = local_6f0[2];
          uStack_c88 = local_6f0[3];
        }
        local_b80 = local_ca0;
        uStack_b78 = uStack_c98;
        uStack_b70 = uStack_c90;
        uStack_b68 = uStack_c88;
        if ((int)local_b48[1] < 0) {
          local_6e0 = 0;
          in_stack_fffffffffffff31c = 0;
          local_444 = 0;
          local_448 = 0;
          local_44c = 0;
          local_450 = 0;
          local_454 = 0;
          local_458 = 0;
          local_45c = 0;
          local_460 = 0;
          auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
          auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
          auVar17._16_16_ = auVar1;
          auVar17._0_16_ = auVar2;
          local_480._0_8_ = auVar2._0_8_;
          local_480._8_8_ = auVar2._8_8_;
          local_480._16_8_ = auVar1._0_8_;
          local_480._24_8_ = auVar1._8_8_;
          local_ce0 = local_480._0_8_;
          uStack_cd8 = local_480._8_8_;
          uStack_cd0 = local_480._16_8_;
          uStack_cc8 = local_480._24_8_;
          local_480 = auVar17;
        }
        else {
          local_6f8 = (undefined8 *)(local_880 + (long)(int)local_b48[1] * 4);
          local_ce0 = *local_6f8;
          uStack_cd8 = local_6f8[1];
          uStack_cd0 = local_6f8[2];
          uStack_cc8 = local_6f8[3];
        }
        local_ba0 = local_ce0;
        uStack_b98 = uStack_cd8;
        uStack_b90 = uStack_cd0;
        uStack_b88 = uStack_cc8;
        if ((int)local_b48[2] < 0) {
          local_6e4 = 0;
          local_404 = 0;
          local_408 = 0;
          local_40c = 0;
          local_410 = 0;
          local_414 = 0;
          local_418 = 0;
          local_41c = 0;
          local_420 = 0;
          auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
          auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
          auVar18._16_16_ = auVar1;
          auVar18._0_16_ = auVar2;
          local_440._0_8_ = auVar2._0_8_;
          local_440._8_8_ = auVar2._8_8_;
          local_440._16_8_ = auVar1._0_8_;
          local_440._24_8_ = auVar1._8_8_;
          local_d20 = local_440._0_8_;
          uStackY_d18 = local_440._8_8_;
          uStackY_d10 = local_440._16_8_;
          in_stack_fffffffffffff2f8 = (__m256 *)local_440._24_8_;
          local_440 = auVar18;
        }
        else {
          local_700 = (undefined8 *)(local_880 + (long)(int)local_b48[2] * 4);
          local_d20 = *local_700;
          uStackY_d18 = local_700[1];
          uStackY_d10 = local_700[2];
          in_stack_fffffffffffff2f8 = (__m256 *)local_700[3];
        }
        local_bc0 = local_d20;
        uStack_bb8 = uStackY_d18;
        uStack_bb0 = uStackY_d10;
        if ((int)local_b48[3] < 0) {
          local_6e8 = 0;
          local_3c4 = 0;
          local_3c8 = 0;
          local_3cc = 0;
          local_3d0 = 0;
          local_3d4 = 0;
          local_3d8 = 0;
          local_3dc = 0;
          local_3e0 = 0;
          auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
          auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
          auVar19._16_16_ = auVar1;
          auVar19._0_16_ = auVar2;
          local_400._0_8_ = auVar2._0_8_;
          local_400._8_8_ = auVar2._8_8_;
          local_400._16_8_ = auVar1._0_8_;
          local_400._24_8_ = auVar1._8_8_;
          local_d60 = local_400._0_8_;
          uStackY_d58 = local_400._8_8_;
          uStackY_d50 = local_400._16_8_;
          uStackY_d48 = local_400._24_8_;
          local_400 = auVar19;
        }
        else {
          local_708 = (undefined8 *)(local_880 + (long)(int)local_b48[3] * 4);
          local_d60 = *local_708;
          uStackY_d58 = local_708[1];
          uStackY_d50 = local_708[2];
          uStackY_d48 = local_708[3];
        }
        local_be0 = local_d60;
        uStack_bd8 = uStackY_d58;
        uStack_bd0 = uStackY_d50;
        uStack_bc8 = uStackY_d48;
        local_60 = local_9a0;
        uVar7 = local_60;
        uStack_58 = uStack_998;
        uVar8 = uStack_58;
        uStack_50 = uStack_990;
        uVar9 = uStack_50;
        uStack_48 = uStack_988;
        uVar10 = uStack_48;
        local_80 = local_ca0;
        uVar3 = local_80;
        uStack_78 = uStack_c98;
        uVar4 = uStack_78;
        uStack_70 = uStack_c90;
        uVar5 = uStack_70;
        uStack_68 = uStack_c88;
        uVar6 = uStack_68;
        local_60._0_4_ = (float)local_9a0;
        local_60._4_4_ = (float)((ulong)local_9a0 >> 0x20);
        uStack_58._0_4_ = (float)uStack_998;
        uStack_58._4_4_ = (float)((ulong)uStack_998 >> 0x20);
        uStack_50._0_4_ = (float)uStack_990;
        uStack_50._4_4_ = (float)((ulong)uStack_990 >> 0x20);
        uStack_48._0_4_ = (float)uStack_988;
        uStack_48._4_4_ = (undefined4)((ulong)uStack_988 >> 0x20);
        uVar11 = uStack_48._4_4_;
        local_80._0_4_ = (float)local_ca0;
        local_80._4_4_ = (float)((ulong)local_ca0 >> 0x20);
        uStack_78._0_4_ = (float)uStack_c98;
        uStack_78._4_4_ = (float)((ulong)uStack_c98 >> 0x20);
        uStack_70._0_4_ = (float)uStack_c90;
        uStack_70._4_4_ = (float)((ulong)uStack_c90 >> 0x20);
        uStack_68._0_4_ = (float)uStack_c88;
        fVar14 = (float)local_60 * (float)local_80;
        fVar20 = local_60._4_4_ * local_80._4_4_;
        fVar21 = (float)uStack_58 * (float)uStack_78;
        fVar22 = uStack_58._4_4_ * uStack_78._4_4_;
        fVar23 = (float)uStack_50 * (float)uStack_70;
        fVar24 = uStack_50._4_4_ * uStack_70._4_4_;
        fVar25 = (float)uStack_48 * (float)uStack_68;
        lVar12 = (long)local_b4c;
        lVar13 = lVar12 * 0x20;
        local_80 = uVar3;
        uStack_78 = uVar4;
        uStack_70 = uVar5;
        uStack_68 = uVar6;
        local_60 = uVar7;
        uStack_58 = uVar8;
        uStack_50 = uVar9;
        uStack_48 = uVar10;
        local_b00[lVar12 * 8] = fVar14;
        local_b00[lVar12 * 8 + 1] = fVar20;
        *(float *)(&uStack_af8 + lVar12 * 4) = fVar21;
        *(float *)((long)&uStack_af8 + lVar13 + 4) = fVar22;
        afStack_af0[lVar12 * 8] = fVar23;
        afStack_af0[lVar12 * 8 + 1] = fVar24;
        *(float *)(local_ae0 + lVar13 + -8) = fVar25;
        *(undefined4 *)(local_ae0 + lVar13 + -4) = uVar11;
        lVar12 = (long)local_b4c;
        local_658 = local_b00 + lVar12 * 8;
        local_648 = &local_9c0;
        local_650 = &local_ba0;
        local_240._0_4_ = (float)local_ce0;
        local_240._4_4_ = (float)((ulong)local_ce0 >> 0x20);
        uStack_238._0_4_ = (float)uStack_cd8;
        uStack_238._4_4_ = (float)((ulong)uStack_cd8 >> 0x20);
        uStack_230._0_4_ = (float)uStack_cd0;
        uStack_230._4_4_ = (float)((ulong)uStack_cd0 >> 0x20);
        uStack_228._0_4_ = (float)uStack_cc8;
        local_3a0 = local_9c0 * (float)local_240;
        fStack_39c = fStack_9bc * local_240._4_4_;
        fStack_398 = fStack_9b8 * (float)uStack_238;
        fStack_394 = fStack_9b4 * uStack_238._4_4_;
        fStack_390 = fStack_9b0 * (float)uStack_230;
        fStack_38c = fStack_9ac * uStack_230._4_4_;
        fStack_388 = fStack_9a8 * (float)uStack_228;
        uVar3 = *(undefined8 *)local_658;
        uVar4 = (&uStack_af8)[lVar12 * 4];
        uVar5 = *(undefined8 *)(afStack_af0 + lVar12 * 8);
        uVar6 = *(undefined8 *)(local_ae0 + lVar12 * 0x20 + -8);
        local_3c0._0_4_ = (float)uVar3;
        local_3c0._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_3b8._0_4_ = (float)uVar4;
        uStack_3b8._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_3b0._0_4_ = (float)uVar5;
        uStack_3b0._4_4_ = (float)((ulong)uVar5 >> 0x20);
        uStack_3a8._0_4_ = (float)uVar6;
        uStack_3a8._4_4_ = (float)((ulong)uVar6 >> 0x20);
        fVar14 = local_3a0 + (float)local_3c0;
        fVar20 = fStack_39c + local_3c0._4_4_;
        fVar21 = fStack_398 + (float)uStack_3b8;
        fVar22 = fStack_394 + uStack_3b8._4_4_;
        fVar23 = fStack_390 + (float)uStack_3b0;
        fVar24 = fStack_38c + uStack_3b0._4_4_;
        fVar25 = fStack_388 + (float)uStack_3a8;
        fVar26 = fStack_9a4 + uStack_3a8._4_4_;
        lVar12 = (long)local_b4c;
        lVar13 = lVar12 * 0x20;
        local_3c0 = uVar3;
        uStack_3b8 = uVar4;
        uStack_3b0 = uVar5;
        uStack_3a8 = uVar6;
        local_240 = local_ce0;
        uStack_238 = uStack_cd8;
        uStack_230 = uStack_cd0;
        uStack_228 = uStack_cc8;
        local_b00[lVar12 * 8] = fVar14;
        local_b00[lVar12 * 8 + 1] = fVar20;
        *(float *)(&uStack_af8 + lVar12 * 4) = fVar21;
        *(float *)((long)&uStack_af8 + lVar13 + 4) = fVar22;
        afStack_af0[lVar12 * 8] = fVar23;
        afStack_af0[lVar12 * 8 + 1] = fVar24;
        *(float *)(local_ae0 + lVar13 + -8) = fVar25;
        *(float *)(local_ae0 + lVar13 + -4) = fVar26;
        lVar12 = (long)local_b4c;
        local_670 = local_b00 + lVar12 * 8;
        local_660 = &local_9e0;
        local_668 = &local_bc0;
        local_200._0_4_ = (float)local_d20;
        local_200._4_4_ = (float)((ulong)local_d20 >> 0x20);
        uStack_1f8._0_4_ = (float)uStackY_d18;
        uStack_1f8._4_4_ = (float)((ulong)uStackY_d18 >> 0x20);
        uStack_1f0._0_4_ = (float)uStackY_d10;
        uStack_1f0._4_4_ = (float)((ulong)uStackY_d10 >> 0x20);
        pafStack_1e8._0_4_ = SUB84(in_stack_fffffffffffff2f8,0);
        local_360 = local_9e0 * (float)local_200;
        fStack_35c = fStack_9dc * local_200._4_4_;
        fStack_358 = fStack_9d8 * (float)uStack_1f8;
        fStack_354 = fStack_9d4 * uStack_1f8._4_4_;
        fStack_350 = fStack_9d0 * (float)uStack_1f0;
        fStack_34c = fStack_9cc * uStack_1f0._4_4_;
        fStack_348 = fStack_9c8 * pafStack_1e8._0_4_;
        uVar3 = *(undefined8 *)local_670;
        uVar4 = (&uStack_af8)[lVar12 * 4];
        uVar5 = *(undefined8 *)(afStack_af0 + lVar12 * 8);
        uVar6 = *(undefined8 *)(local_ae0 + lVar12 * 0x20 + -8);
        local_380._0_4_ = (float)uVar3;
        local_380._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_378._0_4_ = (float)uVar4;
        uStack_378._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_370._0_4_ = (float)uVar5;
        uStack_370._4_4_ = (float)((ulong)uVar5 >> 0x20);
        uStack_368._0_4_ = (float)uVar6;
        uStack_368._4_4_ = (float)((ulong)uVar6 >> 0x20);
        fVar14 = local_360 + (float)local_380;
        fVar20 = fStack_35c + local_380._4_4_;
        fVar21 = fStack_358 + (float)uStack_378;
        fVar22 = fStack_354 + uStack_378._4_4_;
        fVar23 = fStack_350 + (float)uStack_370;
        fVar24 = fStack_34c + uStack_370._4_4_;
        fVar25 = fStack_348 + (float)uStack_368;
        fVar26 = fStack_9c4 + uStack_368._4_4_;
        lVar12 = (long)local_b4c;
        lVar13 = lVar12 * 0x20;
        local_380 = uVar3;
        uStack_378 = uVar4;
        uStack_370 = uVar5;
        uStack_368 = uVar6;
        local_200 = local_d20;
        uStack_1f8 = uStackY_d18;
        uStack_1f0 = uStackY_d10;
        pafStack_1e8 = in_stack_fffffffffffff2f8;
        local_b00[lVar12 * 8] = fVar14;
        local_b00[lVar12 * 8 + 1] = fVar20;
        *(float *)(&uStack_af8 + lVar12 * 4) = fVar21;
        *(float *)((long)&uStack_af8 + lVar13 + 4) = fVar22;
        afStack_af0[lVar12 * 8] = fVar23;
        afStack_af0[lVar12 * 8 + 1] = fVar24;
        *(float *)(local_ae0 + lVar13 + -8) = fVar25;
        *(float *)(local_ae0 + lVar13 + -4) = fVar26;
        lVar12 = (long)local_b4c;
        local_688 = local_b00 + lVar12 * 8;
        local_678 = &local_a00;
        local_680 = &local_be0;
        local_1c0._0_4_ = (float)local_d60;
        local_1c0._4_4_ = (float)((ulong)local_d60 >> 0x20);
        uStack_1b8._0_4_ = (float)uStackY_d58;
        uStack_1b8._4_4_ = (float)((ulong)uStackY_d58 >> 0x20);
        uStack_1b0._0_4_ = (float)uStackY_d50;
        uStack_1b0._4_4_ = (float)((ulong)uStackY_d50 >> 0x20);
        uStack_1a8._0_4_ = (float)uStackY_d48;
        local_320 = local_a00 * (float)local_1c0;
        fStack_31c = fStack_9fc * local_1c0._4_4_;
        fStack_318 = fStack_9f8 * (float)uStack_1b8;
        fStack_314 = fStack_9f4 * uStack_1b8._4_4_;
        fStack_310 = fStack_9f0 * (float)uStack_1b0;
        fStack_30c = fStack_9ec * uStack_1b0._4_4_;
        fStack_308 = fStack_9e8 * (float)uStack_1a8;
        uVar3 = *(undefined8 *)local_688;
        uVar4 = (&uStack_af8)[lVar12 * 4];
        uVar5 = *(undefined8 *)(afStack_af0 + lVar12 * 8);
        uVar6 = *(undefined8 *)(local_ae0 + lVar12 * 0x20 + -8);
        local_340._0_4_ = (float)uVar3;
        local_340._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_338._0_4_ = (float)uVar4;
        uStack_338._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_330._0_4_ = (float)uVar5;
        uStack_330._4_4_ = (float)((ulong)uVar5 >> 0x20);
        uStack_328._0_4_ = (float)uVar6;
        uStack_328._4_4_ = (float)((ulong)uVar6 >> 0x20);
        fVar14 = local_320 + (float)local_340;
        fVar20 = fStack_31c + local_340._4_4_;
        fVar21 = fStack_318 + (float)uStack_338;
        fVar22 = fStack_314 + uStack_338._4_4_;
        fVar23 = fStack_310 + (float)uStack_330;
        fVar24 = fStack_30c + uStack_330._4_4_;
        fVar25 = fStack_308 + (float)uStack_328;
        fVar26 = fStack_9e4 + uStack_328._4_4_;
        lVar12 = (long)local_b4c;
        lVar13 = lVar12 * 0x20;
        local_340 = uVar3;
        uStack_338 = uVar4;
        uStack_330 = uVar5;
        uStack_328 = uVar6;
        local_1c0 = local_d60;
        uStack_1b8 = uStackY_d58;
        uStack_1b0 = uStackY_d50;
        uStack_1a8 = uStackY_d48;
        local_b00[lVar12 * 8] = fVar14;
        local_b00[lVar12 * 8 + 1] = fVar20;
        *(float *)(&uStack_af8 + lVar12 * 4) = fVar21;
        *(float *)((long)&uStack_af8 + lVar13 + 4) = fVar22;
        afStack_af0[lVar12 * 8] = fVar23;
        afStack_af0[lVar12 * 8 + 1] = fVar24;
        *(float *)(local_ae0 + lVar13 + -8) = fVar25;
        *(float *)(local_ae0 + lVar13 + -4) = fVar26;
        local_b48 = local_b48 + 4;
        pafStack_ba8 = in_stack_fffffffffffff2f8;
      }
      local_a0 = (float)local_a20;
      fStack_9c = (float)((ulong)local_a20 >> 0x20);
      fStack_98 = (float)uStack_a18;
      fStack_94 = (float)((ulong)uStack_a18 >> 0x20);
      fStack_90 = (float)uStack_a10;
      fStack_8c = (float)((ulong)uStack_a10 >> 0x20);
      fStack_88 = (float)uStack_a08;
      fStack_84 = (float)((ulong)uStack_a08 >> 0x20);
      local_c0 = local_b00[0];
      fStack_bc = local_b00[1];
      fStack_b8 = (float)uStack_af8;
      fStack_b4 = (float)((ulong)uStack_af8 >> 0x20);
      fStack_b0 = afStack_af0[0];
      fStack_ac = afStack_af0[1];
      fStack_a8 = (float)uStack_ae8;
      local_698 = local_ae0;
      local_690 = &local_a40;
      local_6a0 = &local_c00;
      local_180 = (float)local_ae0._0_8_;
      fStack_17c = SUB84(local_ae0._0_8_,4);
      fStack_178 = (float)local_ae0._8_8_;
      fStack_174 = SUB84(local_ae0._8_8_,4);
      fStack_170 = (float)local_ae0._16_8_;
      fStack_16c = SUB84(local_ae0._16_8_,4);
      fStack_168 = (float)local_ae0._24_8_;
      local_2e0 = local_a40 * local_180;
      fStack_2dc = fStack_a3c * fStack_17c;
      fStack_2d8 = fStack_a38 * fStack_178;
      fStack_2d4 = fStack_a34 * fStack_174;
      fStack_2d0 = fStack_a30 * fStack_170;
      fStack_2cc = fStack_a2c * fStack_16c;
      fStack_2c8 = fStack_a28 * fStack_168;
      local_300 = CONCAT44(fStack_9c * fStack_bc,local_a0 * local_c0);
      uStack_2f8 = CONCAT44(fStack_94 * fStack_b4,fStack_98 * fStack_b8);
      uStack_2f0 = CONCAT44(fStack_8c * fStack_ac,fStack_90 * fStack_b0);
      uStack_2e8 = CONCAT44(fStack_84,fStack_88 * fStack_a8);
      local_c00 = local_2e0 + local_a0 * local_c0;
      fStack_bfc = fStack_2dc + fStack_9c * fStack_bc;
      fStack_bf8 = fStack_2d8 + fStack_98 * fStack_b8;
      fStack_bf4 = fStack_2d4 + fStack_94 * fStack_b4;
      fStack_bf0 = fStack_2d0 + fStack_90 * fStack_b0;
      fStack_bec = fStack_2cc + fStack_8c * fStack_ac;
      fStack_be8 = fStack_2c8 + fStack_88 * fStack_a8;
      local_6b0 = local_ac0;
      local_6a8 = &local_a60;
      local_6b8 = &local_c00;
      local_140 = (float)local_ac0._0_8_;
      fStack_13c = SUB84(local_ac0._0_8_,4);
      fStack_138 = (float)local_ac0._8_8_;
      fStack_134 = SUB84(local_ac0._8_8_,4);
      fStack_130 = (float)local_ac0._16_8_;
      fStack_12c = SUB84(local_ac0._16_8_,4);
      fStack_128 = (float)local_ac0._24_8_;
      local_2a0 = local_a60 * local_140;
      fStack_29c = fStack_a5c * fStack_13c;
      fStack_298 = fStack_a58 * fStack_138;
      fStack_294 = fStack_a54 * fStack_134;
      fStack_290 = fStack_a50 * fStack_130;
      fStack_28c = fStack_a4c * fStack_12c;
      fStack_288 = fStack_a48 * fStack_128;
      local_2c0 = CONCAT44(fStack_bfc,local_c00);
      uStack_2b8 = CONCAT44(fStack_bf4,fStack_bf8);
      uStack_2b0 = CONCAT44(fStack_bec,fStack_bf0);
      uStack_2a8 = CONCAT44(fStack_a24 + fStack_84,fStack_be8);
      local_c00 = local_2a0 + local_c00;
      fStack_bfc = fStack_29c + fStack_bfc;
      fStack_bf8 = fStack_298 + fStack_bf8;
      fStack_bf4 = fStack_294 + fStack_bf4;
      fStack_bf0 = fStack_290 + fStack_bf0;
      fStack_bec = fStack_28c + fStack_bec;
      fStack_be8 = fStack_288 + fStack_be8;
      fStack_be4 = fStack_a44 + fStack_a24 + fStack_84;
      local_6c8 = local_aa0;
      local_6c0 = &local_a80;
      local_6d0 = &local_c00;
      local_100 = (float)local_aa0._0_8_;
      fStack_fc = SUB84(local_aa0._0_8_,4);
      fStack_f8 = (float)local_aa0._8_8_;
      fStack_f4 = SUB84(local_aa0._8_8_,4);
      fStack_f0 = (float)local_aa0._16_8_;
      fStack_ec = SUB84(local_aa0._16_8_,4);
      fStack_e8 = (float)local_aa0._24_8_;
      local_260 = local_a80 * local_100;
      fStack_25c = fStack_a7c * fStack_fc;
      fStack_258 = fStack_a78 * fStack_f8;
      fStack_254 = fStack_a74 * fStack_f4;
      fStack_250 = fStack_a70 * fStack_f0;
      fStack_24c = fStack_a6c * fStack_ec;
      fStack_248 = fStack_a68 * fStack_e8;
      local_280 = CONCAT44(fStack_bfc,local_c00);
      uStack_278 = CONCAT44(fStack_bf4,fStack_bf8);
      uStack_270 = CONCAT44(fStack_bec,fStack_bf0);
      uStack_268 = CONCAT44(fStack_be4,fStack_be8);
      local_c00 = local_260 + local_c00;
      fStack_bfc = fStack_25c + fStack_bfc;
      fStack_bf8 = fStack_258 + fStack_bf8;
      fStack_bf4 = fStack_254 + fStack_bf4;
      fStack_bf0 = fStack_250 + fStack_bf0;
      fStack_bec = fStack_24c + fStack_bec;
      fStack_be8 = fStack_248 + fStack_be8;
      fStack_be4 = fStack_a64 + fStack_be4;
      local_620 = local_8d0;
      local_640 = CONCAT44(fStack_bfc,local_c00);
      uStack_638 = CONCAT44(fStack_bf4,fStack_bf8);
      uStack_630 = CONCAT44(fStack_bec,fStack_bf0);
      uStack_628 = CONCAT44(fStack_be4,fStack_be8);
      *local_8d0 = local_640;
      local_8d0[1] = uStack_638;
      local_8d0[2] = uStack_630;
      local_8d0[3] = uStack_628;
      local_8d0 = local_8d0 + 4;
      local_920 = local_920 + 0x12;
    }
  }
  return;
}

Assistant:

static void gridsample_2d_bicubic_apply_interpolation_p8(const Mat& src, Mat& dst, Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            __m256 x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3;
            __m256 y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3;
            __m256 value_f[4];
            cubic_interp1d_p8(x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3, _mm256_set1_ps(offset_value_ptr[0]));
            cubic_interp1d_p8(y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3, _mm256_set1_ps(offset_value_ptr[1]));

            const int* offset_ptr = (int*)offset_value_ptr + 2;

            for (int ii = 0; ii < 4; ii++)
            {
                __m256 x0_val = offset_ptr[0] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[0]) : _mm256_set1_ps(0);
                __m256 x1_val = offset_ptr[1] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[1]) : _mm256_set1_ps(0);
                __m256 x2_val = offset_ptr[2] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[2]) : _mm256_set1_ps(0);
                __m256 x3_val = offset_ptr[3] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[3]) : _mm256_set1_ps(0);

                value_f[ii] = _mm256_mul_ps(x_coeffs0, x0_val);
                value_f[ii] = _mm256_comp_fmadd_ps(x_coeffs1, x1_val, value_f[ii]);
                value_f[ii] = _mm256_comp_fmadd_ps(x_coeffs2, x2_val, value_f[ii]);
                value_f[ii] = _mm256_comp_fmadd_ps(x_coeffs3, x3_val, value_f[ii]);

                offset_ptr += 4;
            }

            __m256 _v = _mm256_mul_ps(y_coeffs0, value_f[0]);
            _v = _mm256_comp_fmadd_ps(y_coeffs1, value_f[1], _v);
            _v = _mm256_comp_fmadd_ps(y_coeffs2, value_f[2], _v);
            _v = _mm256_comp_fmadd_ps(y_coeffs3, value_f[3], _v);
            _mm256_storeu_ps(dstptr, _v);

            dstptr += 8;
            offset_value_ptr += 18;
        }
    }
}